

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int main(int ac,char **av)

{
  int ac_00;
  int iVar1;
  uv_loop_t *loop;
  int ret;
  undefined1 local_30 [8];
  CommandLineArguments args;
  char **av_local;
  int ac_local;
  
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = av;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources
            (*args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (1 < ac_00) {
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"--build");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_build(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      goto LAB_00147332;
    }
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"--install");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_install(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      goto LAB_00147332;
    }
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"--open");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_open(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      goto LAB_00147332;
    }
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"-E");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_command(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      goto LAB_00147332;
    }
  }
  av_local._4_4_ =
       do_cmake(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cmDynamicLoader::FlushCache();
  loop = uv_default_loop();
  uv_loop_close(loop);
LAB_00147332:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return av_local._4_4_;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "--install") == 0) {
      return do_install(ac, av);
    }
    if (strcmp(av[1], "--open") == 0) {
      return do_open(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  uv_loop_close(uv_default_loop());
  return ret;
}